

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSLSocket.cpp
# Opt level: O2

ssize_t __thiscall
blc::network::SSLSocket::read_abi_cxx11_(SSLSocket *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  exception *this_00;
  undefined4 in_register_00000034;
  char tmp;
  duration<double,_std::ratio<1L,_1000L>_> local_58;
  string local_50;
  
  (this->super_Socket).super_stream._vptr_stream = (_func_int **)&(this->super_Socket)._address;
  *(undefined8 *)&(this->super_Socket)._socket = 0;
  *(undefined1 *)&(this->super_Socket)._address._M_dataplus._M_p = 0;
  if (*(char *)(CONCAT44(in_register_00000034,__fd) + 0x78) != '\0') {
    while( true ) {
      iVar1 = SSL_read(*(SSL **)(CONCAT44(in_register_00000034,__fd) + 0x80),&tmp,1);
      if (((iVar1 < 1) || (tmp == '\0')) || (tmp == '\n')) break;
      std::__cxx11::string::push_back((char)this);
      local_58.__r = 1.0;
      std::this_thread::sleep_for<double,std::ratio<1l,1000l>>(&local_58);
    }
    return (ssize_t)this;
  }
  this_00 = (exception *)__cxa_allocate_exception(0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"not opened",(allocator<char> *)&local_58);
  error::exception::exception(this_00,&local_50);
  __cxa_throw(this_00,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

std::string blc::network::SSLSocket::read() const {
	std::string	str;
	char		tmp;
	int		ret;

	if (this->_opened == false)
		throw blc::error::exception("not opened");
	while ((ret = SSL_read(this->_ssl, &tmp, 1)) > 0) {
		if (ret == -1)
			throw new blc::error::exception("read error");
		if (tmp == '\n' || tmp == '\0')
			break;
		str += tmp;
		std::this_thread::sleep_for(std::chrono::duration<double, std::milli>(1));
	}
	return (str);
}